

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

string * __thiscall
google::protobuf::descriptor_unittest::EmbedAggregateValue_abi_cxx11_
          (string *__return_storage_ptr__,descriptor_unittest *this,char *value)

{
  Arg *in_R8;
  string_view format;
  Arg local_58;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  descriptor_unittest *local_18;
  char *value_local;
  
  local_18 = this;
  value_local = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" message_type { name: \"Foo\" } extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_MESSAGE type_name: \"Foo\"             extendee: \"google.protobuf.FileOptions\" }options { uninterpreted_option { name { name_part: \"foo\"                                         is_extension: true }                                  $0 } }"
            );
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_58,(Nullable<const_char_*>)local_18);
  format._M_str = (char *)&local_58;
  format._M_len = (size_t)local_28._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_28._M_len,format,in_R8);
  return __return_storage_ptr__;
}

Assistant:

static std::string EmbedAggregateValue(const char* value) {
  return absl::Substitute(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "message_type { name: \"Foo\" } "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_MESSAGE type_name: \"Foo\" "
      "            extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 $0 } }",
      value);
}